

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O2

void __thiscall
t_ocaml_generator::generate_deserialize_struct
          (t_ocaml_generator *this,ostream *out,t_struct *tstruct)

{
  t_program *ptVar1;
  int iVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  string name;
  string prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0 [32];
  string local_80;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string(local_a0,"",(allocator *)&local_c0);
  ptVar1 = (tstruct->super_t_type).program_;
  if ((ptVar1 != (t_program *)0x0) &&
     (ptVar1 != (this->super_t_oop_generator).super_t_generator.program_)) {
    std::__cxx11::string::string((string *)&local_60,(string *)&ptVar1->name_);
    t_generator::capitalize(&local_40,(t_generator *)this,&local_60);
    std::operator+(&local_c0,&local_40,"_types.");
    std::__cxx11::string::operator=(local_a0,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
  }
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  std::__cxx11::string::string((string *)&local_80,(string *)CONCAT44(extraout_var,iVar2));
  t_generator::decapitalize(&local_c0,(t_generator *)this,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  poVar3 = std::operator<<(out,"(");
  poVar3 = std::operator<<(poVar3,local_a0);
  poVar3 = std::operator<<(poVar3,"read_");
  poVar3 = std::operator<<(poVar3,(string *)&local_c0);
  std::operator<<(poVar3," iprot)");
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string(local_a0);
  return;
}

Assistant:

void t_ocaml_generator::generate_deserialize_struct(ostream& out, t_struct* tstruct) {
  string prefix = "";
  t_program* program = tstruct->get_program();
  if (program != nullptr && program != program_) {
    prefix = capitalize(program->get_name()) + "_types.";
  }
  string name = decapitalize(tstruct->get_name());
  out << "(" << prefix << "read_" << name << " iprot)";
}